

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    if (key == 0x20) {
      cur_icon_color = (cur_icon_color + 1) % 5;
      set_icon(window,cur_icon_color);
    }
    else if (key == 0x58) {
      glfwSetWindowIcon(window,0,(GLFWimage *)0x0);
    }
    else if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        case GLFW_KEY_SPACE:
            cur_icon_color = (cur_icon_color + 1) % 5;
            set_icon(window, cur_icon_color);
            break;
        case GLFW_KEY_X:
            glfwSetWindowIcon(window, 0, NULL);
            break;
    }
}